

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O3

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int *piVar15;
  int nn;
  int iVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  undefined8 *puVar24;
  ulong uVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  undefined8 *puVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_f8 [64];
  size_t local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar1 = bottom_im2col->w;
  uVar31 = (ulong)(int)uVar1;
  iVar16 = bottom_im2col->h;
  uVar22 = bottom_im2col->c;
  uVar2 = top_blob->c;
  local_b8 = 0;
  local_f8._16_8_ = 0;
  local_f8._24_4_ = 0;
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_f8._32_8_ = (Allocator *)0x0;
  local_f8._40_4_ = 0;
  local_f8._44_4_ = 0;
  uVar21 = (uVar1 & 1) + (uVar1 >> 1);
  if ((long)uVar31 < 2) {
    uVar21 = uVar1;
  }
  Mat::create((Mat *)local_f8,iVar16 << (1 < (long)uVar31),uVar22,uVar21,8,8,(Allocator *)opt);
  if (0 < (int)uVar1 >> 1) {
    lVar17 = 0;
    uVar19 = 0;
    do {
      if (0 < (int)uVar22) {
        pauVar23 = (undefined1 (*) [16])(local_b8 * uVar19 * local_f8._16_8_ + local_f8._0_8_);
        uVar25 = 0;
        do {
          if (0 < iVar16) {
            pauVar27 = (undefined1 (*) [16])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar17);
            iVar29 = iVar16;
            do {
              *pauVar23 = *pauVar27;
              pauVar23 = pauVar23 + 1;
              pauVar27 = (undefined1 (*) [16])(*pauVar27 + (ulong)uVar1 * 8);
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar22);
      }
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar19 != (uint)((int)uVar1 >> 1));
  }
  uVar19 = uVar31 & 0xfffffffffffffffe;
  if ((uint)uVar19 != uVar1) {
    pvVar18 = (void *)(uVar19 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar22) {
        uVar21 = ((uint)(uVar19 >> 0x1f) & 1) + (int)uVar19;
        puVar24 = (undefined8 *)
                  ((long)(int)(((int)uVar21 >> 1) + ((int)uVar19 - (uVar21 & 0xfffffffe))) *
                   local_b8 * local_f8._16_8_ + local_f8._0_8_);
        uVar25 = 0;
        do {
          if (0 < iVar16) {
            puVar28 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + (long)pvVar18);
            iVar29 = iVar16;
            do {
              *puVar24 = *puVar28;
              puVar24 = puVar24 + 1;
              puVar28 = puVar28 + uVar31;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar22);
      }
      uVar19 = uVar19 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
    } while ((long)uVar19 < (long)uVar31);
  }
  if (0 < (int)uVar2) {
    iVar16 = iVar16 * uVar22;
    uVar19 = 0;
    do {
      pauVar23 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar19 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar1 < 2) {
        uVar25 = 0;
      }
      else {
        lVar17 = 0;
        uVar20 = 0;
        do {
          if (iVar16 < 1) {
            auVar38 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            auVar35 = (undefined1  [16])0x0;
            auVar32 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            auVar33 = (undefined1  [16])0x0;
          }
          else {
            lVar26 = kernel->cstep * uVar19 * kernel->elemsize;
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar30 = 0;
            local_138 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            iVar29 = iVar16;
            auVar32 = ZEXT816(0) << 0x40;
            auVar38 = ZEXT816(0) << 0x40;
            auVar35 = ZEXT816(0) << 0x40;
            do {
              local_48 = auVar35;
              local_98 = auVar38;
              local_a8 = auVar32;
              auVar33 = *(undefined1 (*) [16])
                         (local_f8._0_8_ + lVar30 + local_b8 * local_f8._16_8_ * lVar17);
              auVar32 = vpcmpgtb_avx((undefined1  [16])0x0,auVar33);
              auVar13 = vpunpcklbw_avx(auVar33,auVar32);
              auVar12 = vpunpckhbw_avx(auVar33,auVar32);
              auVar33 = *(undefined1 (*) [16])((long)kernel->data + lVar30 * 2 + lVar26);
              auVar32 = *(undefined1 (*) [16])((long)kernel->data + lVar30 * 2 + lVar26 + 0x10);
              auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar33);
              auVar38 = vpcmpgtb_avx((undefined1  [16])0x0,auVar32);
              auVar14 = vpunpcklbw_avx(auVar33,auVar35);
              auVar33 = vpunpckhbw_avx(auVar33,auVar35);
              auVar35 = vpunpcklbw_avx(auVar32,auVar38);
              auVar32 = vpunpckhbw_avx(auVar32,auVar38);
              auVar8 = vpmullw_avx(auVar14,auVar13);
              auVar3 = vpmulhw_avx(auVar13,auVar14);
              auVar9 = vpmullw_avx(auVar33,auVar13);
              auVar4 = vpmulhw_avx(auVar13,auVar33);
              auVar10 = vpmullw_avx(auVar35,auVar13);
              auVar5 = vpmulhw_avx(auVar13,auVar35);
              auVar11 = vpmullw_avx(auVar32,auVar13);
              auVar13 = vpmulhw_avx(auVar13,auVar32);
              local_58 = vpmullw_avx(auVar14,auVar12);
              auVar14 = vpmulhw_avx(auVar12,auVar14);
              local_68 = vpmullw_avx(auVar33,auVar12);
              auVar6 = vpmulhw_avx(auVar12,auVar33);
              local_78 = vpmullw_avx(auVar35,auVar12);
              auVar7 = vpmulhw_avx(auVar12,auVar35);
              local_88 = vpmullw_avx(auVar32,auVar12);
              auVar12 = vpmulhw_avx(auVar12,auVar32);
              auVar33 = vpunpcklwd_avx(auVar8,auVar3);
              auVar33 = vpaddd_avx(auVar39._0_16_,auVar33);
              auVar32 = vpunpcklwd_avx(auVar9,auVar4);
              auVar32 = vpaddd_avx(auVar32,local_138);
              auVar35 = vpunpcklwd_avx(auVar10,auVar5);
              auVar35 = vpaddd_avx(auVar35,local_128);
              auVar38 = vpunpcklwd_avx(auVar11,auVar13);
              auVar38 = vpaddd_avx(auVar38,local_a8);
              auVar3 = vpunpckhwd_avx(auVar8,auVar3);
              auVar33 = vpaddd_avx(auVar33,auVar3);
              auVar39 = ZEXT1664(auVar33);
              auVar3 = vpunpckhwd_avx(auVar9,auVar4);
              local_138 = vpaddd_avx(auVar32,auVar3);
              auVar32 = vpunpckhwd_avx(auVar10,auVar5);
              local_128 = vpaddd_avx(auVar35,auVar32);
              auVar32 = vpunpckhwd_avx(auVar11,auVar13);
              auVar32 = vpaddd_avx(auVar38,auVar32);
              auVar35 = vpunpcklwd_avx(local_58,auVar14);
              auVar35 = vpaddd_avx(auVar35,local_48);
              auVar38 = vpunpcklwd_avx(local_68,auVar6);
              auVar38 = vpaddd_avx(auVar38,local_148);
              auVar3 = vpunpcklwd_avx(local_78,auVar7);
              auVar3 = vpaddd_avx(auVar3,local_118);
              auVar4 = vpunpcklwd_avx(local_88,auVar12);
              auVar4 = vpaddd_avx(auVar4,local_98);
              auVar5 = vpunpckhwd_avx(local_58,auVar14);
              auVar35 = vpaddd_avx(auVar35,auVar5);
              auVar5 = vpunpckhwd_avx(local_68,auVar6);
              local_148 = vpaddd_avx(auVar38,auVar5);
              auVar38 = vpunpckhwd_avx(local_78,auVar7);
              local_118 = vpaddd_avx(auVar3,auVar38);
              auVar38 = vpunpckhwd_avx(local_88,auVar12);
              auVar38 = vpaddd_avx(auVar4,auVar38);
              lVar30 = lVar30 + 0x10;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
          auVar4 = vpunpckldq_avx(auVar33,local_138);
          auVar5 = vpunpckldq_avx(local_128,auVar32);
          auVar3 = vpunpckhdq_avx(auVar33,local_138);
          auVar32 = vpunpckhdq_avx(local_128,auVar32);
          auVar13 = vpunpckldq_avx(auVar35,local_148);
          auVar14 = vpunpckldq_avx(local_118,auVar38);
          auVar35 = vpunpckhdq_avx(auVar35,local_148);
          auVar38 = vpunpckhdq_avx(local_118,auVar38);
          auVar6 = vpunpcklqdq_avx(auVar4,auVar5);
          auVar33 = vpunpckhqdq_avx(auVar4,auVar5);
          auVar33 = vpaddd_avx(auVar6,auVar33);
          auVar4 = vpunpcklqdq_avx(auVar3,auVar32);
          auVar32 = vpunpckhqdq_avx(auVar3,auVar32);
          auVar32 = vpaddd_avx(auVar32,auVar4);
          auVar33 = vpaddd_avx(auVar33,auVar32);
          auVar3 = vpunpcklqdq_avx(auVar13,auVar14);
          auVar32 = vpunpckhqdq_avx(auVar13,auVar14);
          auVar32 = vpaddd_avx(auVar3,auVar32);
          auVar3 = vpunpcklqdq_avx(auVar35,auVar38);
          auVar35 = vpunpckhqdq_avx(auVar35,auVar38);
          auVar35 = vpaddd_avx(auVar35,auVar3);
          auVar32 = vpaddd_avx(auVar32,auVar35);
          *pauVar23 = auVar33;
          pauVar23[1] = auVar32;
          pauVar23 = pauVar23 + 2;
          uVar25 = uVar20 + 2;
          lVar26 = uVar20 + 3;
          lVar17 = lVar17 + 1;
          uVar20 = uVar25;
        } while (lVar26 < (long)uVar31);
      }
      if ((int)uVar25 < (int)uVar1) {
        do {
          if (iVar16 < 1) {
            auVar33 = (undefined1  [16])0x0;
            auVar32 = (undefined1  [16])0x0;
            auVar35 = (undefined1  [16])0x0;
            auVar38 = (undefined1  [16])0x0;
          }
          else {
            pauVar27 = (undefined1 (*) [16])
                       (kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar17 = 0;
            auVar36 = ZEXT1664((undefined1  [16])0x0);
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            auVar34 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   *(ulong *)(local_f8._0_8_ +
                             lVar17 * 8 +
                             local_b8 * local_f8._16_8_ *
                             (ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)));
              auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar32);
              auVar13 = vpunpcklbw_avx(auVar32,auVar33);
              auVar33 = *pauVar27;
              auVar32 = pauVar27[1];
              auVar35 = vpcmpgtb_avx((undefined1  [16])0x0,auVar33);
              auVar38 = vpcmpgtb_avx((undefined1  [16])0x0,auVar32);
              auVar3 = vpunpcklbw_avx(auVar33,auVar35);
              auVar33 = vpunpckhbw_avx(auVar33,auVar35);
              auVar35 = vpunpcklbw_avx(auVar32,auVar38);
              auVar32 = vpunpckhbw_avx(auVar32,auVar38);
              auVar14 = vpmullw_avx(auVar3,auVar13);
              auVar3 = vpmulhw_avx(auVar3,auVar13);
              auVar6 = vpmullw_avx(auVar13,auVar33);
              auVar4 = vpmulhw_avx(auVar13,auVar33);
              auVar7 = vpmullw_avx(auVar13,auVar35);
              auVar5 = vpmulhw_avx(auVar13,auVar35);
              auVar12 = vpmullw_avx(auVar13,auVar32);
              auVar13 = vpmulhw_avx(auVar13,auVar32);
              auVar33 = vpunpcklwd_avx(auVar14,auVar3);
              auVar33 = vpaddd_avx(auVar34._0_16_,auVar33);
              auVar32 = vpunpcklwd_avx(auVar6,auVar4);
              auVar32 = vpaddd_avx(auVar37._0_16_,auVar32);
              auVar35 = vpunpcklwd_avx(auVar7,auVar5);
              auVar35 = vpaddd_avx(auVar36._0_16_,auVar35);
              auVar38 = vpunpcklwd_avx(auVar12,auVar13);
              auVar38 = vpaddd_avx(auVar39._0_16_,auVar38);
              auVar3 = vpunpckhwd_avx(auVar14,auVar3);
              auVar33 = vpaddd_avx(auVar33,auVar3);
              auVar34 = ZEXT1664(auVar33);
              auVar3 = vpunpckhwd_avx(auVar6,auVar4);
              auVar32 = vpaddd_avx(auVar32,auVar3);
              auVar37 = ZEXT1664(auVar32);
              auVar3 = vpunpckhwd_avx(auVar7,auVar5);
              auVar35 = vpaddd_avx(auVar35,auVar3);
              auVar36 = ZEXT1664(auVar35);
              auVar3 = vpunpckhwd_avx(auVar12,auVar13);
              auVar38 = vpaddd_avx(auVar38,auVar3);
              auVar39 = ZEXT1664(auVar38);
              pauVar27 = pauVar27 + 2;
              lVar17 = lVar17 + 1;
            } while (iVar16 != (int)lVar17);
          }
          auVar3 = vpunpckldq_avx(auVar33,auVar32);
          auVar4 = vpunpckldq_avx(auVar35,auVar38);
          auVar32 = vpunpckhdq_avx(auVar33,auVar32);
          auVar35 = vpunpckhdq_avx(auVar35,auVar38);
          auVar38 = vpunpcklqdq_avx(auVar3,auVar4);
          auVar33 = vpunpckhqdq_avx(auVar3,auVar4);
          auVar33 = vpaddd_avx(auVar38,auVar33);
          auVar38 = vpunpcklqdq_avx(auVar32,auVar35);
          auVar32 = vpunpckhqdq_avx(auVar32,auVar35);
          auVar32 = vpaddd_avx(auVar32,auVar38);
          auVar33 = vpaddd_avx(auVar33,auVar32);
          *pauVar23 = auVar33;
          pauVar23 = pauVar23 + 1;
          uVar22 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar22;
        } while (uVar22 != uVar1);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar2);
  }
  piVar15 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_f8._0_8_ != (void *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_f8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            int64_t* tmpptr = tmp.channel(i / 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
        for (; i + 1 < size; i += 2)
        {
            const signed char* tmpptr = tmp.channel(i / 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));

                tmpptr += 16;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                tmpptr += 8;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}